

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::
emplace_back<slang::ast::DistExpression::DistItem&>
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,DistItem *args)

{
  undefined8 *puVar1;
  size_type sVar2;
  ulong uVar3;
  Expression *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined7 uVar8;
  pointer pDVar9;
  pointer pDVar10;
  pointer pDVar11;
  pointer pDVar12;
  EVP_PKEY_CTX *pEVar13;
  EVP_PKEY_CTX *ctx;
  long lVar14;
  pointer pDVar15;
  
  pDVar15 = this->data_ + this->len;
  if (this->len != this->cap) {
    pEVar4 = args->value;
    uVar5 = *(undefined8 *)
             &(args->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
    bVar7 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
    uVar8 = *(undefined7 *)
             &(args->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
    (pDVar15->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
    _M_value.expr =
         (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
         _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
         _M_value.expr;
    (pDVar15->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
    _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
         bVar7;
    *(undefined7 *)
     &(pDVar15->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
         uVar8;
    pDVar15->value = pEVar4;
    *(undefined8 *)
     &(pDVar15->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
         uVar5;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return this->data_ + sVar2;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar13 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar13 < ctx) {
    pEVar13 = ctx;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    pEVar13 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar14 = (long)pDVar15 - (long)this->data_;
  pDVar9 = (pointer)operator_new((long)pEVar13 << 5);
  pEVar4 = args->value;
  uVar5 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload;
  uVar6 = *(undefined8 *)
           &(args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
  puVar1 = (undefined8 *)((long)pDVar9 + lVar14 + 0x10);
  *puVar1 = (args->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_payload._M_value.expr;
  puVar1[1] = uVar6;
  *(undefined8 *)((long)pDVar9 + lVar14) = pEVar4;
  ((undefined8 *)((long)pDVar9 + lVar14))[1] = uVar5;
  pDVar12 = this->data_;
  pDVar10 = pDVar12 + this->len;
  pDVar11 = pDVar9;
  if (pDVar10 == pDVar15) {
    for (; pDVar12 != pDVar15; pDVar12 = pDVar12 + 1) {
      pEVar4 = pDVar12->value;
      uVar5 = *(undefined8 *)
               &(pDVar12->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar7 = (pDVar12->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar8 = *(undefined7 *)
               &(pDVar12->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar12->weight).
           super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload._M_value.
           expr;
      (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar7;
      *(undefined7 *)
       &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar8;
      pDVar11->value = pEVar4;
      *(undefined8 *)
       &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar5;
      pDVar11 = pDVar11 + 1;
    }
  }
  else {
    for (; pDVar12 != pDVar15; pDVar12 = pDVar12 + 1) {
      pEVar4 = pDVar12->value;
      uVar5 = *(undefined8 *)
               &(pDVar12->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      bVar7 = (pDVar12->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      uVar8 = *(undefined7 *)
               &(pDVar12->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11;
      (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
      _M_value.expr =
           (pDVar12->weight).
           super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload._M_value.
           expr;
      (pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           bVar7;
      *(undefined7 *)
       &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.field_0x11 =
           uVar8;
      pDVar11->value = pEVar4;
      *(undefined8 *)
       &(pDVar11->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload =
           uVar5;
      pDVar11 = pDVar11 + 1;
    }
    puVar1 = (undefined8 *)(lVar14 + (long)pDVar9);
    for (; pDVar15 != pDVar10; pDVar15 = pDVar15 + 1) {
      pEVar4 = pDVar15->value;
      uVar5 = *(undefined8 *)
               &(pDVar15->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
      uVar6 = *(undefined8 *)
               &(pDVar15->weight).
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged;
      puVar1[6] = (pDVar15->weight).
                  super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                  _M_payload._M_value.expr;
      puVar1[7] = uVar6;
      puVar1[4] = pEVar4;
      puVar1[5] = uVar5;
      puVar1 = puVar1 + 4;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar13;
  this->data_ = pDVar9;
  return (reference)((long)pDVar9 + lVar14);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }